

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

void __thiscall GusteauChapter2UI::Run(GusteauChapter2UI *this,ApplicationContextBase *ac)

{
  bool bVar1;
  size_type sVar2;
  long in_RSI;
  int i;
  size_t sz;
  char *in_stack_00000078;
  int id;
  char *in_stack_00000080;
  ApplicationContext *ac_ptr;
  ImVec2 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  Blackboard *in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_51;
  string local_50 [4];
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  ImVec2 local_28;
  ImVec2 local_20;
  long local_18;
  
  local_18 = in_RSI;
  ImGui::Text("Hello Chapter 2");
  ImVec2::ImVec2(&local_20,0.0,0.0);
  bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
  if (bVar1) {
    csp_emit((CSP *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  sprintf(Run::tick_text,"tick: %d",(ulong)*(uint *)(local_18 + 0x50));
  ImGui::TextUnformatted(in_stack_00000080,in_stack_00000078);
  ImGui::InputText((char *)in_stack_ffffffffffffffa0,
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (size_t)in_stack_ffffffffffffff90,
                   (ImGuiInputTextFlags)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (ImGuiInputTextCallback)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  ImVec2::ImVec2(&local_28,0.0,0.0);
  bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
  if (bVar1) {
    operator_new(0x30);
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
    data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)CONCAT44(in_stack_ffffffffffffff9c,uVar4),
               (allocator<char> *)in_stack_ffffffffffffff90);
    Data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Data
              ((Data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),data);
    in_stack_ffffffffffffff64 =
         blackboard_new_entry
                   (in_stack_ffffffffffffff88,
                    (TypedData *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    csp_emit((CSP *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,0.0,0.0);
  bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
  if (bVar1) {
    csp_emit((CSP *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  ImGui::TextUnformatted(in_stack_00000080,in_stack_00000078);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_18 + 0x58));
  for (iVar3 = 0; (ulong)(long)iVar3 < sVar2; iVar3 = iVar3 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_18 + 0x58),(long)iVar3);
    std::__cxx11::string::c_str();
    ImGui::TextUnformatted(in_stack_00000080,in_stack_00000078);
  }
  return;
}

Assistant:

virtual void Run(ApplicationContextBase& ac) override
    {
        auto ac_ptr = reinterpret_cast<ApplicationContext*>(&ac);

        ImGui::Text("Hello Chapter 2");
        if (ImGui::Button("Quit"))
        {
///>
/// The UI in chapter two uses the CSP mechanism to do it's work,
/// instead of setting variables on the ApplicationContext as it did previously.
///<C++
            csp_emit(ac_ptr->csp, "quit", 0);
        }
        static char tick_text[128];
        sprintf(tick_text, "tick: %d", ac_ptr->count);
        ImGui::TextUnformatted(tick_text);

        static char buff[256];
        ImGui::InputText("Line: ", buff, sizeof(buff));
        if (ImGui::Button("Append"))
        {
            int id = blackboard_new_entry(ac_ptr->blackboard, new Data<std::string>(std::string{buff}));
            csp_emit(ac_ptr->csp, "append_line", id);
        }
        if (ImGui::Button("Pop"))
        {
            csp_emit(ac_ptr->csp, "pop_line", 0);
        }
        ImGui::TextUnformatted("------ LINES ------");
        size_t sz = ac_ptr->lines.size();
        for (auto i = 0; i < sz; ++i)
        {
            ImGui::TextUnformatted(ac_ptr->lines[i].c_str());
        }
    }